

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::SetRawReissueAsset
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
          *issuances,
          vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
          *issuance_output)

{
  bool bVar1;
  undefined8 in_RCX;
  ConfidentialTransactionController *in_RDI;
  long in_R8;
  IssuanceOutput output;
  IssuanceParameter issuance_param;
  ByteData nonce;
  Script locking_script;
  TxInReissuanceParameters *issuance;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  *__range2;
  ConfidentialTransactionController *ctxc;
  ByteData *in_stack_fffffffffffffde8;
  IssuanceOutput *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  value_type *__x;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe04;
  Txid local_1e0;
  uint32_t local_1c0;
  BlindFactor local_1b8;
  ConfidentialAssetId local_198 [2];
  BlindFactor local_148;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  Script *in_stack_fffffffffffffef8;
  Amount *in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff0c;
  Txid *in_stack_ffffffffffffff10;
  ConfidentialTransactionController *in_stack_ffffffffffffff18;
  ByteData *in_stack_ffffffffffffff30;
  BlindFactor *in_stack_ffffffffffffff38;
  BlindFactor *in_stack_ffffffffffffff40;
  ByteData local_b0;
  Script local_88;
  reference local_50;
  TxInReissuanceParameters *local_48;
  __normal_iterator<const_cfd::api::TxInReissuanceParameters_*,_std::vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>_>
  local_40;
  undefined8 local_38;
  undefined1 local_29;
  long local_28;
  undefined8 local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            ((ConfidentialTransactionController *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_stack_fffffffffffffdf8
            );
  local_38 = local_20;
  local_40._M_current =
       (TxInReissuanceParameters *)
       std::
       vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
       ::begin((vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
                *)in_stack_fffffffffffffde8);
  local_48 = (TxInReissuanceParameters *)
             std::
             vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
             ::end((vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
                    *)in_stack_fffffffffffffde8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::TxInReissuanceParameters_*,_std::vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>_>
                             *)in_stack_fffffffffffffdf0,
                            (__normal_iterator<const_cfd::api::TxInReissuanceParameters_*,_std::vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>_>
                             *)in_stack_fffffffffffffde8), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_cfd::api::TxInReissuanceParameters_*,_std::vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>_>
               ::operator*(&local_40);
    core::AbstractTxOut::GetLockingScript(&local_88,&(local_50->asset_txout).super_AbstractTxOut);
    core::ConfidentialTxOut::GetNonce
              ((ConfidentialNonce *)&stack0xffffffffffffff28,&local_50->asset_txout);
    core::ConfidentialNonce::GetData(&local_b0,(ConfidentialNonce *)&stack0xffffffffffffff28);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x590088);
    in_stack_fffffffffffffdf0 = (IssuanceOutput *)&local_50->blind_factor;
    __x = (value_type *)&local_50->entropy;
    in_stack_fffffffffffffde8 = &local_b0;
    uVar2 = 0;
    ConfidentialTransactionController::SetAssetReissuance
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,(bool)in_stack_fffffffffffffef7,
               (bool)in_stack_fffffffffffffef6);
    if (local_28 != 0) {
      IssuanceOutput::IssuanceOutput((IssuanceOutput *)CONCAT44(in_stack_fffffffffffffe04,uVar2));
      core::Txid::operator=(&local_1e0,&local_50->txid);
      local_1c0 = local_50->vout;
      core::ConfidentialAssetId::operator=
                (local_198,(ConfidentialAssetId *)&stack0xfffffffffffffed8);
      core::BlindFactor::operator=(&local_1b8,&local_148);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::push_back
                ((vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,uVar2),__x);
      IssuanceOutput::~IssuanceOutput(in_stack_fffffffffffffdf0);
    }
    core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffffdf0);
    core::ByteData::~ByteData((ByteData *)0x590238);
    core::Script::~Script((Script *)in_stack_fffffffffffffdf0);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxInReissuanceParameters_*,_std::vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>_>
    ::operator++(&local_40);
  }
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::SetRawReissueAsset(
    const std::string& tx_hex,
    const std::vector<TxInReissuanceParameters>& issuances,
    std::vector<IssuanceOutput>* issuance_output) {
  ConfidentialTransactionController ctxc(tx_hex);

  for (const auto& issuance : issuances) {
    Script locking_script = issuance.asset_txout.GetLockingScript();
    ByteData nonce = issuance.asset_txout.GetNonce().GetData();

    IssuanceParameter issuance_param = ctxc.SetAssetReissuance(
        issuance.txid, issuance.vout, issuance.amount, locking_script, nonce,
        issuance.blind_factor, issuance.entropy, false);

    if (issuance_output != nullptr) {
      IssuanceOutput output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.output.asset = issuance_param.asset;
      output.output.entropy = issuance_param.entropy;
      issuance_output->push_back(output);
    }
  }
  return ctxc;
}